

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O2

bool mg::data::is_nxx_data(string_view *in)

{
  bool bVar1;
  int iStack_18;
  Nxx header;
  
  if (in->_M_len < 0x10) {
    fwrite("NXX file too small\n",0x13,1,_stderr);
    bVar1 = false;
  }
  else {
    iStack_18 = (int)*(undefined8 *)in->_M_str;
    if (iStack_18 == 0x5843584e) {
      bVar1 = true;
    }
    else {
      bVar1 = iStack_18 == 0x5847584e;
    }
  }
  return bVar1;
}

Assistant:

bool is_nxx_data(const std::string_view &in) {
  // Test big enough to have header
  if (in.size() < sizeof(Nxx)) {
    fprintf(stderr, "NXX file too small\n");
    return false;
  }

  // Check for known file magic
  Nxx header = *reinterpret_cast<const Nxx *>(in.data());

  if (!strncmp(header.magic, MAGIC_NXCX, sizeof(header.magic))) {
    return true;
  }

  if (!strncmp(header.magic, MAGIC_NXGX, sizeof(header.magic))) {
    return true;
  }

  return false;
}